

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matryoshka.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer *ppDVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__return_storage_ptr__;
  _Vector_base<Domain,_std::allocator<Domain>_> *this;
  int iVar2;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *data;
  size_type start1;
  undefined8 uVar3;
  int *piVar4;
  size_t *psVar5;
  pointer __last;
  size_t sVar6;
  undefined1 this_00 [8];
  pointer __position;
  int areaCovered;
  int iVar7;
  typed_value<double,_char> *ptVar8;
  char *pcVar9;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar10;
  typed_value<unsigned_long,_char> *ptVar11;
  typed_value<bool,_char> *ptVar12;
  typed_value<int,_char> *ptVar13;
  size_type sVar14;
  ostream *poVar15;
  ulong uVar16;
  double **VI_S;
  double *pdVar17;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var18;
  int iVar19;
  ulong uVar20;
  int i;
  undefined8 uVar21;
  long lVar22;
  pointer *ppiVar23;
  string *this_01;
  size_type *psVar24;
  int iVar25;
  ulong uVar26;
  undefined8 uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  bool bVar31;
  float fVar32;
  double dVar33;
  undefined1 auVar34 [16];
  size_type asStack_850 [2];
  undefined1 *puStack_840;
  double dStack_838;
  MatrixProperties local_830;
  MatrixProperties local_7d8;
  MatrixProperties local_780;
  MatrixProperties local_728;
  MatrixProperties local_6d0;
  MatrixProperties local_678;
  MatrixProperties local_620;
  options_description local_5c8 [8];
  options_description opts;
  string local_548;
  _Vector_base<Domain,_std::allocator<Domain>_> local_528;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_510;
  _Vector_base<Domain,_std::allocator<Domain>_> local_4f8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_4e0;
  undefined1 local_4c8 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_4b8 [144];
  string local_428;
  string local_408;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  __shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_368;
  _Vector_base<Domain,_std::allocator<Domain>_> local_358;
  undefined1 local_340 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> consensusFile_1;
  DomainSet dConsensusHier_1;
  WeightedDomainEnsemble dEnsemble;
  undefined1 local_2b0 [8];
  shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  mat_topass;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> consensusFile;
  undefined1 auStack_278 [8];
  vector<Domain,_std::allocator<Domain>_> dConsensusHier;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  allMu;
  undefined1 local_218 [8];
  vector<int,_std::allocator<int>_> PAMresult;
  vector<int,_std::allocator<int>_> temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> multiscaleFile;
  undefined1 auStack_1b8 [8];
  MatrixProperties matProp;
  undefined1 local_158 [8];
  Params p;
  vector<Domain,_std::allocator<Domain>_> dConsensusParent;
  undefined1 local_a8 [8];
  shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  mat;
  undefined1 auStack_78 [8];
  vector<Domain,_std::allocator<Domain>_> dConsensusHierTemp;
  ulong local_50;
  int local_38;
  
  local_158 = (undefined1  [8])&p.inputFile._M_string_length;
  p.inputFile._M_dataplus._M_p = (pointer)0x0;
  p.inputFile._M_string_length._0_1_ = 0;
  p.inputFile.field_2._8_8_ = &p.outputPrefix._M_string_length;
  p.outputPrefix._M_dataplus._M_p = (pointer)0x0;
  p.outputPrefix._M_string_length._0_1_ = 0;
  p._104_8_ = &p.chrom._M_string_length;
  p.chrom._M_dataplus._M_p = (pointer)0x0;
  p.chrom._M_string_length._0_1_ = 0;
  puStack_840 = (undefined1 *)0x136b58;
  std::__cxx11::string::string((string *)local_4c8,"matryoshka options",(allocator *)auStack_1b8);
  puStack_840 = (undefined1 *)0x136b78;
  boost::program_options::options_description::options_description
            (local_5c8,(string *)local_4c8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  puStack_840 = (undefined1 *)0x136b84;
  std::__cxx11::string::~string((string *)local_4c8);
  puStack_840 = (undefined1 *)0x136b90;
  auStack_1b8 = (undefined1  [8])boost::program_options::options_description::add_options();
  puStack_840 = (undefined1 *)0x136ba3;
  ptVar8 = boost::program_options::value<double>((double *)((long)&p.outputPrefix.field_2 + 8));
  ptVar8->m_required = true;
  puStack_840 = (undefined1 *)0x136bc7;
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (auStack_1b8,(value_semantic *)"gammaMax,g",(char *)ptVar8);
  puStack_840 = (undefined1 *)0x136bd6;
  ptVar8 = boost::program_options::value<double>(&p.gammaMax);
  dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puStack_840 = (undefined1 *)0x136be9;
  ptVar8 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar8,(double *)
                             &dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
  puStack_840 = (undefined1 *)0x136c02;
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"gammaMin,x",(char *)ptVar8);
  puStack_840 = (undefined1 *)0x136c18;
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,"help,h");
  puStack_840 = (undefined1 *)0x136c27;
  ptVar10 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_158);
  ptVar10->m_required = true;
  puStack_840 = (undefined1 *)0x136c47;
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"input,i",(char *)ptVar10);
  puStack_840 = (undefined1 *)0x136c56;
  ptVar11 = boost::program_options::value<unsigned_long>((unsigned_long *)&p.gammaMin);
  temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1;
  puStack_840 = (undefined1 *)0x136c6c;
  ptVar11 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                      (ptVar11,(unsigned_long *)
                               &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
  puStack_840 = (undefined1 *)0x136c85;
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"topK,k",(char *)ptVar11);
  puStack_840 = (undefined1 *)0x136c94;
  ptVar12 = boost::program_options::value<bool>((bool *)&p.stepSize);
  ptVar12->m_zero_tokens = true;
  PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  puStack_840 = (undefined1 *)0x136cad;
  ptVar12 = boost::program_options::typed_value<bool,_char>::default_value
                      (ptVar12,(bool *)&PAMresult.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  puStack_840 = (undefined1 *)0x136cc6;
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"outputMultiscale,m",(char *)ptVar12);
  puStack_840 = (undefined1 *)0x136cd5;
  ptVar13 = boost::program_options::value<int>((int *)((long)&p.stepSize + 4));
  local_340._0_4_ = 100;
  puStack_840 = (undefined1 *)0x136cea;
  ptVar13 = boost::program_options::typed_value<int,_char>::default_value(ptVar13,(int *)local_340);
  puStack_840 = (undefined1 *)0x136d03;
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"minMeanSamples,n",(char *)ptVar13);
  puStack_840 = (undefined1 *)0x136d12;
  ptVar10 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&p.inputFile.field_2 + 8));
  ptVar10->m_required = true;
  puStack_840 = (undefined1 *)0x136d32;
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"output,o",(char *)ptVar10);
  puStack_840 = (undefined1 *)0x136d41;
  ptVar8 = boost::program_options::value<double>((double *)&p.k);
  mat_topass.
  super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fa999999999999a;
  puStack_840 = (undefined1 *)0x136d5d;
  ptVar8 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar8,(double *)
                             &mat_topass.
                              super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
  puStack_840 = (undefined1 *)0x136d76;
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"stepSize,s",(char *)ptVar8);
  puStack_840 = (undefined1 *)0x136d85;
  ptVar13 = boost::program_options::value<int>((int *)&p.outputMultiscale);
  local_218._0_4_ = 40000;
  puStack_840 = (undefined1 *)0x136d9a;
  ptVar13 = boost::program_options::typed_value<int,_char>::default_value(ptVar13,(int *)local_218);
  puStack_840 = (undefined1 *)0x136db3;
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"resolution,r",(char *)ptVar13);
  puStack_840 = (undefined1 *)0x136dc2;
  ptVar12 = boost::program_options::value<bool>((bool *)&p.minMeanSamples);
  ptVar12->m_zero_tokens = true;
  p.chrom.field_2._8_8_ = p.chrom.field_2._8_8_ & 0xffffffffffffff00;
  puStack_840 = (undefined1 *)0x136ddb;
  ptVar12 = boost::program_options::typed_value<bool,_char>::default_value
                      (ptVar12,(bool *)(p.chrom.field_2._M_local_buf + 8));
  puStack_840 = (undefined1 *)0x136df4;
  pcVar9 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar9,(value_semantic *)"parseSparseFormat,R",(char *)ptVar12);
  piVar4 = &p.resolution;
  puStack_840 = (undefined1 *)0x136e06;
  ptVar10 = boost::program_options::value<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)piVar4);
  puStack_840 = (undefined1 *)0x136e23;
  std::__cxx11::string::string((string *)local_4c8,"N/A",(allocator *)auStack_278);
  puStack_840 = (undefined1 *)0x136e32;
  ptVar10 = boost::program_options::
            typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
            ::default_value(ptVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_4c8);
  puStack_840 = (undefined1 *)0x136e4b;
  boost::program_options::options_description_easy_init::operator()
            (pcVar9,(value_semantic *)"chromosome,c",(char *)ptVar10);
  puStack_840 = (undefined1 *)0x136e57;
  std::__cxx11::string::~string((string *)local_4c8);
  puStack_840 = (undefined1 *)0x136e63;
  boost::program_options::variables_map::variables_map((variables_map *)local_4c8);
  local_3e8.super_function_base.vtable = (vtable_base *)0x0;
  local_3e8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_3e8.super_function_base.functor._8_8_ = 0;
  local_3e8.super_function_base.functor._16_8_ = 0;
  puStack_840 = (undefined1 *)0x136e92;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)auStack_1b8,argc,argv,local_5c8,0,&local_3e8);
  puStack_840 = (undefined1 *)0x136ea7;
  boost::program_options::store
            ((basic_parsed_options *)auStack_1b8,(variables_map *)local_4c8,false);
  puStack_840 = (undefined1 *)0x136eb3;
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)auStack_1b8);
  puStack_840 = (undefined1 *)0x136ebf;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_3e8);
  puStack_840 = (undefined1 *)0x136ed9;
  std::__cxx11::string::string
            ((string *)auStack_1b8,"help",
             (allocator *)
             &dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  puStack_840 = (undefined1 *)0x136eef;
  sVar14 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count(local_4b8,(key_type *)auStack_1b8);
  puStack_840 = (undefined1 *)0x136efe;
  std::__cxx11::string::~string((string *)auStack_1b8);
  if (sVar14 == 0) {
    puStack_840 = (undefined1 *)0x136f13;
    boost::program_options::notify((variables_map *)local_4c8);
    puStack_840 = (undefined1 *)0x136f2d;
    std::__cxx11::string::string
              ((string *)auStack_1b8,"input",
               (allocator *)
               &dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    puStack_840 = (undefined1 *)0x136f3c;
    sVar14 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count(local_4b8,(key_type *)auStack_1b8);
    puStack_840 = (undefined1 *)0x136f4b;
    std::__cxx11::string::~string((string *)auStack_1b8);
    if (sVar14 != 0) {
      puStack_840 = (undefined1 *)0x136f67;
      poVar15 = std::operator<<((ostream *)&std::cerr,"Reading input from ");
      puStack_840 = (undefined1 *)0x136f76;
      poVar15 = std::operator<<(poVar15,(string *)local_158);
      puStack_840 = (undefined1 *)0x136f85;
      std::operator<<(poVar15,".\n");
      puStack_840 = (undefined1 *)0x136f9b;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_1b8,"chr",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)piVar4);
      puStack_840 = (undefined1 *)0x136fad;
      std::__cxx11::string::operator=((string *)piVar4,(string *)auStack_1b8);
      puStack_840 = (undefined1 *)0x136fb5;
      std::__cxx11::string::~string((string *)auStack_1b8);
      auStack_1b8 = (undefined1  [8])0x0;
      matProp.matrix.
      super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      matProp.matrix.
      super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&matProp.chrom._M_string_length;
      matProp.chrom._M_dataplus._M_p = (pointer)0x0;
      matProp.chrom._M_string_length._0_1_ = 0;
      matProp.BI.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      matProp.resolution = 0;
      matProp._52_4_ = 0;
      matProp.BI.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      if ((char)p.minMeanSamples == '\x01') {
        puStack_840 = (undefined1 *)0x136ff3;
        std::__cxx11::string::string((string *)&local_3c8,(string *)local_158);
        puStack_840 = (undefined1 *)0x137008;
        std::__cxx11::string::string((string *)&local_3a8,(string *)piVar4);
        puStack_840 = (undefined1 *)0x137024;
        parseSparseMatrix((MatrixProperties *)
                          &dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,&local_3c8,p._96_4_,
                          &local_3a8);
        ppDVar1 = &dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        puStack_840 = (undefined1 *)0x13703a;
        MatrixProperties::operator=((MatrixProperties *)auStack_1b8,(MatrixProperties *)ppDVar1);
        puStack_840 = (undefined1 *)0x137042;
        MatrixProperties::~MatrixProperties((MatrixProperties *)ppDVar1);
        puStack_840 = (undefined1 *)0x13704e;
        std::__cxx11::string::~string((string *)&local_3a8);
        this_01 = &local_3c8;
      }
      else {
        puStack_840 = (undefined1 *)0x13706a;
        std::__cxx11::string::string((string *)&local_388,(string *)local_158);
        puStack_840 = (undefined1 *)0x13707d;
        parseGZipMatrix((MatrixProperties *)
                        &dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,&local_388);
        ppDVar1 = &dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        puStack_840 = (undefined1 *)0x137093;
        MatrixProperties::operator=((MatrixProperties *)auStack_1b8,(MatrixProperties *)ppDVar1);
        puStack_840 = (undefined1 *)0x13709b;
        MatrixProperties::~MatrixProperties((MatrixProperties *)ppDVar1);
        this_01 = &local_388;
      }
      puStack_840 = (undefined1 *)0x1370a7;
      std::__cxx11::string::~string((string *)this_01);
      puStack_840 = (undefined1 *)0x1370ba;
      std::
      __shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr((__shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)local_a8,
                     (__shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)auStack_1b8);
      puStack_840 = (undefined1 *)0x1370cd;
      poVar15 = std::operator<<((ostream *)&std::cerr,"MatrixParser read matrix of size: ");
      puStack_840 = (undefined1 *)0x1370df;
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      puStack_840 = (undefined1 *)0x1370ee;
      poVar15 = std::operator<<(poVar15," x ");
      puStack_840 = (undefined1 *)0x137101;
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      puStack_840 = (undefined1 *)0x137110;
      std::operator<<(poVar15,"\n");
      puStack_840 = (undefined1 *)0x137123;
      MatrixProperties::MatrixProperties(&local_678,(MatrixProperties *)auStack_1b8);
      puStack_840 = (undefined1 *)0x13715a;
      multiscaleDomains((WeightedDomainEnsemble *)
                        &dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,&local_678,
                        (float)(double)p.outputPrefix.field_2._8_8_,(float)p.gammaMax,(double)p.k,
                        p.gammaMin._0_4_,p.stepSize._4_4_);
      puStack_840 = (undefined1 *)0x137166;
      MatrixProperties::~MatrixProperties(&local_678);
      puStack_840 = (undefined1 *)0x137179;
      MatrixProperties::MatrixProperties(&local_620,(MatrixProperties *)auStack_1b8);
      puStack_840 = (undefined1 *)0x13718c;
      areaCovered = calCoverage((WeightedDomainEnsemble *)
                                &dConsensusHier_1.
                                 super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,&local_620);
      puStack_840 = (undefined1 *)0x13719b;
      MatrixProperties::~MatrixProperties(&local_620);
      uVar16 = ((long)dEnsemble.domainSets.
                      super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start -
               (long)dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage) / 0x18;
      iVar7 = (int)uVar16;
      if (p.stepSize._0_1_ == '\x01') {
        puStack_840 = (undefined1 *)0x1371d5;
        poVar15 = std::operator<<((ostream *)&std::cerr,"Writing all multi scale domains to file");
        puStack_840 = (undefined1 *)0x1371dd;
        std::endl<char,std::char_traits<char>>(poVar15);
        lVar22 = 0;
        uVar20 = 0;
        if (0 < iVar7) {
          uVar20 = uVar16 & 0xffffffff;
        }
        for (uVar28 = 0; uVar20 != uVar28; uVar28 = uVar28 + 1) {
          puStack_840 = (undefined1 *)0x13722d;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&p.inputFile.field_2 + 8),".multiscale.txt");
          puStack_840 = (undefined1 *)0x13723f;
          std::vector<Domain,_std::allocator<Domain>_>::vector
                    ((vector<Domain,_std::allocator<Domain>_> *)&local_528,
                     (vector<Domain,_std::allocator<Domain>_> *)
                     ((long)&(dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->start + lVar22));
          puStack_840 = (undefined1 *)0x13724e;
          std::__cxx11::string::string
                    ((string *)&local_548,
                     (string *)
                     &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          puStack_840 = (undefined1 *)0x13725d;
          MatrixProperties::MatrixProperties(&local_830,(MatrixProperties *)auStack_1b8);
          puStack_840 = (undefined1 *)0x137286;
          outputDomains((DomainSet *)&local_528,&local_548,&local_830,0,
                        (float)((double)(int)uVar28 * (double)p.k + p.gammaMax));
          puStack_840 = (undefined1 *)0x13728e;
          MatrixProperties::~MatrixProperties(&local_830);
          puStack_840 = (undefined1 *)0x137296;
          std::__cxx11::string::~string((string *)&local_548);
          puStack_840 = (undefined1 *)0x13729e;
          std::_Vector_base<Domain,_std::allocator<Domain>_>::~_Vector_base(&local_528);
          puStack_840 = (undefined1 *)0x1372aa;
          std::__cxx11::string::~string
                    ((string *)
                     &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          lVar22 = lVar22 + 0x18;
        }
      }
      uVar20 = (ulong)iVar7;
      uVar28 = 0;
      uVar29 = -(ulong)(uVar20 >> 0x3d != 0) | uVar20 * 8;
      puStack_840 = (undefined1 *)0x1372e9;
      VI_S = (double **)operator_new__(uVar29);
      uVar26 = 0;
      if (0 < iVar7) {
        uVar26 = uVar16 & 0xffffffff;
      }
      for (; uVar26 != uVar28; uVar28 = uVar28 + 1) {
        puStack_840 = (undefined1 *)0x137306;
        pdVar17 = (double *)operator_new__(uVar29);
        VI_S[uVar28] = pdVar17;
      }
      puStack_840 = (undefined1 *)0x13731e;
      getVImatrix((WeightedDomainEnsemble *)
                  &dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,VI_S);
      puStack_840 = (undefined1 *)0x137331;
      getCluster((vector<int,_std::allocator<int>_> *)local_218,VI_S,iVar7);
      lVar22 = CONCAT44(local_218._4_4_,local_218._0_4_);
      puStack_840 = (undefined1 *)0x13734b;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 &PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<int,_std::allocator<int>_> *)local_218);
      puStack_840 = (undefined1 *)0x13735e;
      _Var18 = std::
               __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (CONCAT71(PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage._1_7_,
                                   PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage._0_1_),
                          temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
      lVar30 = (long)_Var18._M_current -
               CONCAT71(PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._1_7_,
                        PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._0_1_);
      puStack_840 = (undefined1 *)0x13737b;
      poVar15 = std::operator<<((ostream *)&std::cerr,"There are ");
      uVar26 = lVar30 >> 2;
      puStack_840 = (undefined1 *)0x13738e;
      iVar7 = (int)uVar26;
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar7);
      puStack_840 = (undefined1 *)0x13739d;
      poVar15 = std::operator<<(poVar15," levels of hierarchy with clustering: ");
      puStack_840 = (undefined1 *)0x1373a5;
      std::endl<char,std::char_traits<char>>(poVar15);
      uVar28 = (ulong)((long)PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start - lVar22) >> 2;
      uVar29 = 0;
      uVar16 = uVar28 & 0xffffffff;
      if ((int)uVar28 < 1) {
        uVar16 = uVar29;
      }
      for (; uVar16 != uVar29; uVar29 = uVar29 + 1) {
        puStack_840 = (undefined1 *)0x1373d8;
        poVar15 = (ostream *)
                  std::ostream::operator<<
                            (&std::cerr,
                             *(int *)(CONCAT44(local_218._4_4_,local_218._0_4_) + uVar29 * 4));
        puStack_840 = (undefined1 *)0x1373e3;
        std::operator<<(poVar15," ");
      }
      puStack_840 = (undefined1 *)0x1373f4;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      dVar33 = p.gammaMax;
      uVar28 = (uVar26 & 0xffffffff) * 8 + 0xf & 0xfffffffffffffff0;
      lVar22 = -uVar28;
      pdVar17 = (double *)((long)&dStack_838 + lVar22);
      psVar24 = (size_type *)((long)pdVar17 - uVar28);
      piVar4 = (int *)CONCAT44(local_218._4_4_,local_218._0_4_);
      iVar19 = *piVar4;
      *pdVar17 = p.gammaMax;
      *(undefined8 *)((long)psVar24 + (lVar30 * 0x40000000 + -0x100000000 >> 0x1d)) =
           p.outputPrefix.field_2._8_8_;
      sVar6 = p.k;
      iVar25 = 0;
      for (uVar28 = 0; uVar16 != uVar28; uVar28 = uVar28 + 1) {
        iVar2 = piVar4[uVar28];
        if (iVar19 != iVar2) {
          lVar30 = (long)iVar25;
          iVar25 = iVar25 + 1;
          *(double *)((long)&local_830 + lVar30 * 8 + lVar22) = dVar33;
          psVar24[lVar30] = (size_type)(dVar33 - (double)sVar6);
          iVar19 = iVar2;
        }
        dVar33 = dVar33 + (double)sVar6;
      }
      p.chrom.field_2._8_8_ = 0;
      auStack_278 = (undefined1  [8])0x0;
      dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_78 = (undefined1  [8])0x0;
      dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      psVar24[-1] = 0x1374e1;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,uVar20,
               (allocator_type *)
               &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
      lVar30 = 0;
      ppiVar23 = &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_end_of_storage;
      for (dVar33 = p.gammaMax; dVar33 <= (double)p.outputPrefix.field_2._8_8_ + 1e-05;
          dVar33 = dVar33 + (double)p.k) {
        psVar24[-1] = 0x13752e;
        std::
        __shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_368,
                       (__shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        *)local_a8);
        iVar19 = p.stepSize._4_4_;
        psVar24[-1] = 0x137544;
        getMu((vector<double,_std::allocator<double>_> *)ppiVar23,
              (shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
               *)&local_368,(float)dVar33,iVar19);
        psVar5 = &(dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage)->start;
        psVar24[-1] = 0x137556;
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  ((vector<double,_std::allocator<double>_> *)((long)psVar5 + lVar30),ppiVar23);
        psVar24[-1] = 0x13755e;
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)ppiVar23);
        psVar24[-1] = 0x137566;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_368._M_refcount);
        lVar30 = lVar30 + 0x18;
      }
      iVar19 = 0;
      iVar25 = 0;
      if (0 < iVar7) {
        iVar25 = iVar7;
      }
      psVar24[-1] = 1;
      uVar27 = psVar24[-1];
      psVar24[-1] = 1;
      uVar16 = psVar24[-1];
      local_38 = (int)uVar27;
      local_50 = 0;
      for (; uVar16 != iVar25 + 1; uVar16 = uVar16 + 1) {
        if (uVar16 == 1) {
          p.outputPrefix.field_2._8_8_ = *psVar24;
          p.gammaMax = *pdVar17;
          psVar24[-1] = 0x137600;
          MatrixProperties::MatrixProperties(&local_728,(MatrixProperties *)auStack_1b8);
          iVar2 = p.stepSize._4_4_;
          sVar6 = p.k;
          iVar7 = p.gammaMin._0_4_;
          dVar33 = p.gammaMax;
          mat.
          super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p.outputPrefix.field_2._8_8_;
          psVar24[-1] = 0x137651;
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::vector(&local_510,
                   (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)&dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
          fVar32 = (float)(double)mat.
                                  super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi;
          psVar24[-2] = local_50;
          psVar24[-3] = 0x137690;
          multiscaleDomains((WeightedDomainEnsemble *)
                            &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,&local_728,fVar32,
                            (float)dVar33,(double)sVar6,iVar7,iVar2,areaCovered,&local_510,
                            (int)psVar24[-2]);
          psVar24[-1] = 0x13769a;
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_510);
          psVar24[-1] = 0x1376a2;
          MatrixProperties::~MatrixProperties(&local_728);
          __return_storage_ptr__ =
               &mat_topass.
                super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount;
          ppiVar23 = &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          psVar24[-1] = 0x1376bb;
          consensusDomains((DomainSet *)__return_storage_ptr__,(WeightedDomainEnsemble *)ppiVar23);
          psVar24[-1] = 0x1376cd;
          std::vector<Domain,_std::allocator<Domain>_>::_M_move_assign
                    ((vector<Domain,_std::allocator<Domain>_> *)((long)&p.chrom.field_2 + 8),
                     __return_storage_ptr__);
          psVar24[-1] = 0x1376d5;
          std::_Vector_base<Domain,_std::allocator<Domain>_>::~_Vector_base
                    ((_Vector_base<Domain,_std::allocator<Domain>_> *)__return_storage_ptr__);
          psVar24[-1] = 0x1376eb;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&p.inputFile.field_2 + 8),".consensus.txt");
          psVar24[-1] = 0x1376fe;
          poVar15 = std::operator<<((ostream *)&std::cerr,"Writing consensus for level ");
          psVar24[-1] = 1;
          uVar27 = psVar24[-1];
          psVar24[-1] = 0x137713;
          poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)uVar27);
          psVar24[-1] = 0x13771b;
          std::endl<char,std::char_traits<char>>(poVar15);
          psVar24[-1] = 0x13772a;
          std::vector<Domain,_std::allocator<Domain>_>::vector
                    ((vector<Domain,_std::allocator<Domain>_> *)&local_4f8,
                     (vector<Domain,_std::allocator<Domain>_> *)((long)&p.chrom.field_2 + 8));
          psVar24[-1] = 0x13773d;
          std::__cxx11::string::string
                    ((string *)&local_428,
                     (string *)
                     &mat_topass.
                      super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          psVar24[-1] = 0x137753;
          MatrixProperties::MatrixProperties(&local_7d8,(MatrixProperties *)auStack_1b8);
          psVar24[-1] = 1;
          uVar27 = psVar24[-1];
          psVar24[-1] = 0xffffffffffffffff;
          uVar3 = psVar24[-1];
          psVar24[-1] = 0x137776;
          local_38 = outputDomains((DomainSet *)&local_4f8,&local_428,&local_7d8,(int)uVar27,
                                   local_38,(int)uVar3);
          psVar24[-1] = 0x137781;
          MatrixProperties::~MatrixProperties(&local_7d8);
          psVar24[-1] = 0x137789;
          std::__cxx11::string::~string((string *)&local_428);
          psVar24[-1] = 0x137791;
          std::_Vector_base<Domain,_std::allocator<Domain>_>::~_Vector_base(&local_4f8);
          iVar7 = (int)(((double)p.outputPrefix.field_2._8_8_ - p.gammaMax) / (double)p.k + 0.5);
          psVar24[-1] = 0x1377c7;
          std::__cxx11::string::~string
                    ((string *)
                     &mat_topass.
                      super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          psVar24[-1] = 0x1377cf;
          WeightedDomainEnsemble::~WeightedDomainEnsemble((WeightedDomainEnsemble *)ppiVar23);
        }
        else {
          p.outputPrefix.field_2._8_8_ = psVar24[uVar16 - 1];
          p.gammaMax = *(double *)((long)&puStack_840 + uVar16 * 8 + lVar22);
          uVar27 = p.chrom.field_2._8_8_;
          if ((undefined1  [8])
              dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
              super__Vector_impl_data._M_start != auStack_78) {
            psVar24[-1] = 0x137814;
            std::vector<Domain,_std::allocator<Domain>_>::operator=
                      ((vector<Domain,_std::allocator<Domain>_> *)((long)&p.chrom.field_2 + 8),
                       (vector<Domain,_std::allocator<Domain>_> *)auStack_78);
            uVar27 = p.chrom.field_2._8_8_;
            if ((undefined1  [8])
                dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                super__Vector_impl_data._M_start != auStack_78) {
              dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)auStack_78;
            }
          }
          while( true ) {
            this_00 = local_a8;
            ppiVar23 = &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
            if ((undefined8 *)uVar27 == (undefined8 *)0x0) break;
            data = *(matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     **)uVar27;
            start1 = *(size_type *)(uVar27 + 8);
            psVar24[-1] = 0x13786c;
            boost::numeric::ublas::
            subrange<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                      ((matrix_range<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                        *)ppiVar23,(ublas *)this_00,data,start1,(size_type)data,start1,*psVar24);
            psVar24[-1] = 0x13787e;
            boost::numeric::ublas::
            matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
            ::
            matrix<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>>
                      ((matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
                        *)&mat_topass.
                           super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount,
                       (matrix_expression<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                        *)ppiVar23);
            psVar24[-1] = 0x137890;
            std::
            make_shared<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>&>
                      ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                        *)local_2b0);
            psVar24[-1] = 0x1378a9;
            std::
            __shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ::operator=((__shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         *)auStack_1b8,
                        (__shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         *)local_2b0);
            psVar24[-1] = 0x1378b8;
            MatrixProperties::MatrixProperties(&local_6d0,(MatrixProperties *)auStack_1b8);
            iVar2 = p.stepSize._4_4_;
            sVar6 = p.k;
            iVar7 = p.gammaMin._0_4_;
            dVar33 = p.gammaMax;
            mat.
            super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p.outputPrefix.field_2._8_8_;
            psVar24[-1] = 0x137909;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::vector(&local_4e0,
                     (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)&dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
            fVar32 = (float)(double)mat.
                                    super___shared_ptr<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi;
            ppiVar23 = &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
            psVar24[-2] = local_50;
            psVar24[-3] = 0x137952;
            multiscaleDomains((WeightedDomainEnsemble *)ppiVar23,&local_6d0,fVar32,(float)dVar33,
                              (double)sVar6,iVar7,iVar2,areaCovered,&local_4e0,(int)psVar24[-2]);
            psVar24[-1] = 0x13795c;
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::~vector(&local_4e0);
            psVar24[-1] = 0x137964;
            MatrixProperties::~MatrixProperties(&local_6d0);
            this = (_Vector_base<Domain,_std::allocator<Domain>_> *)
                   (&consensusFile_1.field_2._M_allocated_capacity + 1);
            psVar24[-1] = 0x137976;
            consensusDomains((DomainSet *)this,(WeightedDomainEnsemble *)ppiVar23);
            __last = dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar3 = consensusFile_1.field_2._8_8_;
            iVar19 = iVar19 + 1;
            lVar30 = (long)dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>.
                           _M_impl.super__Vector_impl_data._M_start - consensusFile_1.field_2._8_8_;
            psVar24[-1] = 0x18;
            __position = dConsensusHierTemp.super__Vector_base<Domain,_std::allocator<Domain>_>.
                         _M_impl.super__Vector_impl_data._M_start;
            lVar30 = lVar30 / (long)psVar24[-1];
            auVar34._8_4_ = (int)data;
            auVar34._0_8_ = data;
            auVar34._12_4_ = (int)((ulong)data >> 0x20);
            uVar21 = uVar3;
            while (bVar31 = lVar30 != 0, lVar30 = lVar30 + -1, bVar31) {
              *(long *)uVar21 = (long)&data->size1_ + *(long *)uVar21;
              *(long *)(uVar21 + 8) = *(long *)(uVar21 + 8) + auVar34._8_8_;
              uVar21 = uVar21 + 0x18;
            }
            psVar24[-1] = 0x1379d4;
            std::vector<Domain,std::allocator<Domain>>::
            insert<__gnu_cxx::__normal_iterator<Domain*,std::vector<Domain,std::allocator<Domain>>>,void>
                      ((vector<Domain,std::allocator<Domain>> *)auStack_78,
                       (const_iterator)__position,
                       (__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>)
                       uVar3,(__normal_iterator<Domain_*,_std::vector<Domain,_std::allocator<Domain>_>_>
                              )__last);
            psVar24[-1] = 0x1379ee;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_340,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&p.inputFile.field_2 + 8),".consensus.txt");
            psVar24[-1] = 0x1379fd;
            std::vector<Domain,_std::allocator<Domain>_>::vector
                      ((vector<Domain,_std::allocator<Domain>_> *)&local_358,
                       (vector<Domain,_std::allocator<Domain>_> *)this);
            psVar24[-1] = 0x137a10;
            std::__cxx11::string::string((string *)&local_408,(string *)local_340);
            psVar24[-1] = 0x137a26;
            MatrixProperties::MatrixProperties(&local_780,(MatrixProperties *)auStack_1b8);
            psVar24[-1] = 0x137a50;
            local_38 = outputDomains((DomainSet *)&local_358,&local_408,&local_780,(int)uVar16,
                                     local_38,iVar19);
            psVar24[-1] = 0x137a5b;
            MatrixProperties::~MatrixProperties(&local_780);
            psVar24[-1] = 0x137a63;
            std::__cxx11::string::~string((string *)&local_408);
            psVar24[-1] = 0x137a6b;
            std::_Vector_base<Domain,_std::allocator<Domain>_>::~_Vector_base(&local_358);
            psVar24[-1] = 0x137a77;
            std::__cxx11::string::~string((string *)local_340);
            psVar24[-1] = 0x137a7f;
            std::_Vector_base<Domain,_std::allocator<Domain>_>::~_Vector_base(this);
            psVar24[-1] = 0x137a8e;
            WeightedDomainEnsemble::~WeightedDomainEnsemble
                      ((WeightedDomainEnsemble *)
                       &temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            psVar24[-1] = 0x137a9a;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mat_topass);
            psVar24[-1] = 0x137aa6;
            boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::
            ~unbounded_array((unbounded_array<double,_std::allocator<double>_> *)
                             &consensusFile._M_string_length);
            uVar27 = (undefined8 *)(uVar27 + 0x18);
          }
          psVar24[-1] = 0x137acc;
          poVar15 = std::operator<<((ostream *)&std::cerr,"Writing consensus for level ");
          psVar24[-1] = 0x137adf;
          poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)uVar16);
          psVar24[-1] = 0x137ae7;
          std::endl<char,std::char_traits<char>>(poVar15);
          iVar7 = (int)local_50 +
                  (int)(((double)p.outputPrefix.field_2._8_8_ - p.gammaMax) / (double)p.k + 0.5);
        }
        local_50 = (ulong)(iVar7 + 1);
      }
      psVar24[-1] = 0x137b2b;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&dConsensusHier.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      psVar24[-1] = 0x137b34;
      std::_Vector_base<Domain,_std::allocator<Domain>_>::~_Vector_base
                ((_Vector_base<Domain,_std::allocator<Domain>_> *)auStack_78);
      psVar24[-1] = 0x137b40;
      std::_Vector_base<Domain,_std::allocator<Domain>_>::~_Vector_base
                ((_Vector_base<Domain,_std::allocator<Domain>_> *)auStack_278);
      psVar24[-1] = 0x137b4c;
      std::_Vector_base<Domain,_std::allocator<Domain>_>::~_Vector_base
                ((_Vector_base<Domain,_std::allocator<Domain>_> *)((long)&p.chrom.field_2 + 8));
      puStack_840 = (undefined1 *)0x137b5f;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)
                 &PAMresult.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      puStack_840 = (undefined1 *)0x137b6b;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)local_218);
      puStack_840 = (undefined1 *)0x137b77;
      WeightedDomainEnsemble::~WeightedDomainEnsemble
                ((WeightedDomainEnsemble *)
                 &dConsensusHier_1.super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      puStack_840 = (undefined1 *)0x137b83;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mat);
      puStack_840 = (undefined1 *)0x137b8f;
      MatrixProperties::~MatrixProperties((MatrixProperties *)auStack_1b8);
      puStack_840 = (undefined1 *)0x137b9b;
      boost::program_options::variables_map::~variables_map((variables_map *)local_4c8);
      puStack_840 = (undefined1 *)0x137ba7;
      boost::program_options::options_description::~options_description(local_5c8);
      puStack_840 = (undefined1 *)0x137bb3;
      main::Params::~Params((Params *)local_158);
      return 0;
    }
    puStack_840 = (undefined1 *)0x137c20;
    std::operator<<((ostream *)&std::cerr,"Input file was not set.\n");
  }
  else {
    puStack_840 = (undefined1 *)0x137bd7;
    poVar15 = std::operator<<((ostream *)&std::cerr,
                              "\n\t***********************************\n\t****                           ****\n\t****        MATRYOSHKA 1.0     ****\n\t****                           ****\n\t***********************************\n\t"
                             );
    puStack_840 = (undefined1 *)0x137be6;
    std::operator<<(poVar15,"\n");
    puStack_840 = (undefined1 *)0x137bf9;
    poVar15 = (ostream *)boost::program_options::operator<<((ostream *)&std::cerr,local_5c8);
    puStack_840 = (undefined1 *)0x137c08;
    std::operator<<(poVar15,"\n");
  }
  puStack_840 = &LAB_0013802f;
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {
  auto str = R"(
	***********************************
	****                           ****
	****        MATRYOSHKA 1.0     ****
	****                           ****
	***********************************
	)";

  namespace po = boost::program_options;
  using std::string;
  using std::cerr;


  class Params {
    public:
    string inputFile;
    string outputPrefix;
    double gammaMax;
    double gammaMin;
    size_t k;
    double stepSize;
    bool outputMultiscale;
    int minMeanSamples;
    int resolution;
    bool sparseFormat; //rao input data format
    string chrom;
  };

  Params p;

  // Declare the supported options.
  po::options_description opts("matryoshka options");
  opts.add_options()
  ("gammaMax,g", po::value<double>(&p.gammaMax)->required(), "gamma-max (highest resolution to generate domains)")
  ("gammaMin,x", po::value<double>(&p.gammaMin)->default_value(0), "gamma-min (lowest resolution to generate domains)")
  ("help,h", "Produce help message")
  ("input,i", po::value<string>(&p.inputFile)->required(), "Input matrix file, expected format (tab-separated): <chromo>\\t<start>\\t<end>\\t<f1 f2 ...>")
  ("topK,k", po::value<size_t>(&p.k)->default_value(1), "Compute the top k optimal solutions")  
  ("outputMultiscale,m", po::value<bool>(&p.outputMultiscale)->zero_tokens()->default_value(false), "Output multiscale domains that are used for clustering to files as well")
  ("minMeanSamples,n", po::value<int>(&p.minMeanSamples)->default_value(100), "Minimum required number of samples to compute a mean")
  ("output,o", po::value<string>(&p.outputPrefix)->required(), "Output filename prefix")  
  ("stepSize,s", po::value<double>(&p.stepSize)->default_value(0.05), "Step size to increment resolution parameter")
  ("resolution,r", po::value<int>(&p.resolution)->default_value(40000), "Resolution of data")
  ("parseSparseFormat,R", po::value<bool>(&p.sparseFormat)->zero_tokens()->default_value(false), "Parse the sparse matrix format")
  ("chromosome,c", po::value<string>(&p.chrom)->default_value("N/A"), "Chromosome");

  po::variables_map vm;
  try {
    po::store(po::parse_command_line(argc, argv, opts), vm);

    if (vm.count("help")) {
      cerr << str << "\n";
      cerr << opts << "\n";
      std::exit(1);
    }

    po::notify(vm);    

    if (vm.count("input")) {
      double eps = 1e-5;
      cerr << "Reading input from " << p.inputFile << ".\n";

      p.chrom = "chr" + p.chrom;
      MatrixProperties matProp;
      if (p.sparseFormat) {
        matProp = parseSparseMatrix(p.inputFile, p.resolution, p.chrom);
      } else { 
          matProp = parseGZipMatrix(p.inputFile);
      }
      auto mat = matProp.matrix;
      cerr << "MatrixParser read matrix of size: " << mat->size1() << " x " << mat->size2()  << "\n";

      auto dEnsemble = multiscaleDomains(matProp, p.gammaMax, p.gammaMin, p.stepSize, p.k, p.minMeanSamples);

      int areaCovered = calCoverage(dEnsemble, matProp);
      int K = dEnsemble.domainSets.size();

      if (p.outputMultiscale) {
        cerr << "Writing all multi scale domains to file" << endl;
        for (int i=0; i<K; i++){
            auto multiscaleFile = p.outputPrefix + ".multiscale.txt";
            outputDomains(dEnsemble.domainSets[i], multiscaleFile, matProp, 0, p.gammaMin+(i*p.stepSize));
        }
      }
      
      double **VI_S = new double *[K];
      for(int i = 0; i < K; i++)
        VI_S[i] = new double[K];
      getVImatrix(dEnsemble, VI_S);

      //for (int i=0;i<K;i++){
      //  for (int j=0; j<K-1; j++)
      //    cerr << VI_S[i][j] << ",";
      //  cerr << VI_S[i][K-1] << endl;
      //}

      std::vector<int> PAMresult = getCluster(VI_S, K);
      int resultSize = PAMresult.size();
      std::vector<int> temp = PAMresult;
      auto uniqEnd = std::unique(temp.begin(), temp.end());
      int maxHier = std::distance(temp.begin(), uniqEnd);
      
      cerr << "There are " << maxHier << " levels of hierarchy with clustering: " << endl;
      for (int i = 0; i<resultSize; i++){
        cerr << PAMresult[i] << " ";
      }
      cerr << endl;

      double gammaMins[maxHier], gammaMaxes[maxHier], gammaTemp=p.gammaMin;
      int index, indexTemp=PAMresult[0], sizeFill=0;
      gammaMins[0] = p.gammaMin; //start of array min gamma
      gammaMaxes[maxHier-1] = p.gammaMax; //end of array max gamma
      for (int i=0; i<resultSize; i++) {
        index = int(PAMresult[i]);
        if (indexTemp != index) {
          gammaMins[sizeFill+1] = gammaTemp;
          gammaMaxes[sizeFill] = gammaTemp - p.stepSize;
          indexTemp = index;
          sizeFill++;
        }
        gammaTemp += p.stepSize;
      }
      
      int curIndex=1, pIndex=0;
      std::vector<Domain> dConsensusParent, dConsensusHier, dConsensusHierTemp;
      std::vector<std::vector<double>> allMu(K);

      index = 0;
      for (double gamma=p.gammaMin; gamma <= p.gammaMax+eps; gamma+=p.stepSize) {
        allMu[index] = getMu(mat, gamma, p.minMeanSamples);
        index++;
      }

      index = 0;
      for (int hier=1; hier<=maxHier; hier++) {
        if (hier==1) {
          p.gammaMax = gammaMaxes[hier-1];
          p.gammaMin = gammaMins[hier-1];

          auto dEnsemble = multiscaleDomains(matProp, p.gammaMax, p.gammaMin, p.stepSize, p.k, p.minMeanSamples, areaCovered, allMu, index);
          dConsensusParent = consensusDomains(dEnsemble);
          
          auto consensusFile = p.outputPrefix + ".consensus.txt";
          cerr << "Writing consensus for level " << hier << endl;
          curIndex = outputDomains(dConsensusParent, consensusFile, matProp, hier, curIndex, -1);
          index = int(((p.gammaMax - p.gammaMin) / p.stepSize)+0.5) + 1;
        } 
        else { 
          p.gammaMax = gammaMaxes[hier-1];
          p.gammaMin = gammaMins[hier-1];
          if(dConsensusHierTemp.size() > 0) {
            dConsensusParent = dConsensusHierTemp;
            dConsensusHierTemp.clear();
          }

          for (auto d : dConsensusParent) {
            size_t start = d.start;
            size_t end = d.end;
            pIndex++;
            
            //boost::numeric::ublas::compressed_matrix<double> passed_ptr = subrange(*mat, start, end, start, end);
            //using SparseMatrix = boost::numeric::ublas::compressed_matrix<double>;
            //std::shared_ptr<SparseMatrix> mat_topass = make_shared<SparseMatrix>(passed_ptr);
            boost::numeric::ublas::matrix<double> passed_ptr = subrange(*mat, start, end, start, end);
            using SparseMatrix = boost::numeric::ublas::matrix<double>;
            std::shared_ptr<SparseMatrix> mat_topass = make_shared<SparseMatrix>(passed_ptr);
            matProp.matrix = mat_topass;
            auto dEnsemble = multiscaleDomains(matProp, p.gammaMax, p.gammaMin, p.stepSize, p.k, p.minMeanSamples, areaCovered, allMu, index);

            auto dConsensusHier = consensusDomains(dEnsemble);
            for (size_t i=0; i<dConsensusHier.size(); i++){
              dConsensusHier[i].start += start;
              dConsensusHier[i].end += start;
            }
            dConsensusHierTemp.insert(dConsensusHierTemp.end(), dConsensusHier.begin(), dConsensusHier.end());
            auto consensusFile = p.outputPrefix + ".consensus.txt";
            curIndex = outputDomains(dConsensusHier, consensusFile, matProp, hier, curIndex, pIndex);
          }
          cerr << "Writing consensus for level " << hier << endl;
          index += int(((p.gammaMax - p.gammaMin) / p.stepSize)+0.5) + 1;
        }
      }

    } else {
      cerr << "Input file was not set.\n";
      std::exit(1);
    }

  } catch (po::error& e) {
    cerr << "exception : [" << e.what() << "]. Exiting.\n";
    std::exit(1);
  }

  return 0;
}